

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<long_double>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int_type iVar3;
  long *plVar4;
  ulong uVar5;
  streambuf_type *psVar6;
  streambuf_type *psVar7;
  int_type iVar8;
  ulong uVar9;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar10;
  iter_type iVar11;
  undefined1 auVar12 [12];
  istreambuf_iterator<char,_std::char_traits<char>_> local_88;
  iter_type end_local;
  cast_type value;
  int_type local_58;
  string_type tmp;
  
  psVar6 = end._M_sbuf;
  psVar7 = in._M_sbuf;
  iVar8 = end._M_c;
  iVar3 = in._M_c;
  local_88._M_sbuf = psVar7;
  local_88._M_c = iVar3;
  end_local._M_sbuf = psVar6;
  end_local._M_c = iVar8;
  plVar4 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::istream::typeinfo,
                                  0xffffffffffffffff);
  if (((plVar4 == (long *)0x0) ||
      (bVar2 = num_base::use_parent<long_double>(ios,(longdouble)0), bVar2)) ||
     (formatter<char>::create((formatter<char> *)&tmp,ios,&this->loc_,&this->enc_),
     _Var1 = tmp._M_dataplus, psVar7 = local_88._M_sbuf, psVar6 = end_local._M_sbuf,
     iVar3 = local_88._M_c, iVar8 = end_local._M_c, tmp._M_dataplus._M_p == (pointer)0x0)) {
    auVar12 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                        (this,psVar7,iVar3,psVar6,iVar8,ios,err,(short)val);
  }
  else {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&tmp);
    while ((bVar2 = std::operator!=(&local_88,&end_local), bVar2 &&
           (iVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(&local_88),
           (char)iVar3 == '\x7f' || (byte)((char)iVar3 - 1U) < 0x20))) {
      std::streambuf::sbumpc();
      local_88._M_c = -1;
    }
    while (((tmp._M_string_length < 0x1000 && (bVar2 = std::operator!=(&local_88,&end_local), bVar2)
            ) && (iVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(&local_88)
                 , (char)iVar3 != '\n'))) {
      iVar10 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_88,0);
      value = (cast_type)iVar10._M_sbuf;
      local_58 = iVar10._M_c;
      std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)&value);
      std::__cxx11::string::push_back((char)&tmp);
    }
    uVar5 = (**(code **)(*(long *)_Var1._M_p + 0x28))(_Var1._M_p,&tmp,&value);
    uVar9 = tmp._M_string_length;
    if (uVar5 == 0) {
      *(undefined1 *)err = (char)*err | _S_failbit;
    }
    else {
      *val = (longdouble)value;
    }
    for (; uVar5 < uVar9; uVar9 = uVar9 - 1) {
      std::istream::putback((char)plVar4);
    }
    local_88._M_sbuf = *(streambuf_type **)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0xe8);
    local_88._M_c = -1;
    bVar2 = std::istreambuf_iterator<char,_std::char_traits<char>_>::equal(&local_88,&end_local);
    auVar12._8_4_ = local_88._M_c;
    auVar12._0_8_ = local_88._M_sbuf;
    if (bVar2) {
      *(undefined1 *)err = (char)*err | _S_eofbit;
    }
    std::__cxx11::string::~string((string *)&tmp);
    (**(code **)(*(long *)_Var1._M_p + 8))(_Var1._M_p);
  }
  iVar11._12_4_ = 0;
  iVar11._M_sbuf = (streambuf_type *)auVar12._0_8_;
  iVar11._M_c = auVar12._8_4_;
  return iVar11;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }